

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CentralizedFileFormat.cpp
# Opt level: O2

void __thiscall
ser::CentralizedFileFormat::OpenStreamRead
          (CentralizedFileFormat *this,ifstream *stream,string *fieldName,Savepoint *savepoint)

{
  ostream *poVar1;
  offset_t oVar2;
  SerializationException exception;
  SerializationException anon_var_0;
  ostringstream errorstr;
  ostringstream fname;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&fname);
  poVar1 = std::operator<<((ostream *)&fname,(string *)&(this->super_FileFormat).directory_);
  poVar1 = std::operator<<(poVar1,"/");
  poVar1 = std::operator<<(poVar1,(string *)&(this->super_FileFormat).prefix_);
  poVar1 = std::operator<<(poVar1,"_");
  poVar1 = std::operator<<(poVar1,(string *)fieldName);
  std::operator<<(poVar1,".dat");
  oVar2 = OffsetTable::GetOffset((this->super_FileFormat).pOffsetTable_,savepoint,fieldName);
  std::__cxx11::stringbuf::str();
  std::ifstream::open((char *)stream,_errorstr);
  std::__cxx11::string::~string((string *)&errorstr);
  std::istream::seekg(stream,oVar2,0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fname);
  return;
}

Assistant:

void CentralizedFileFormat::OpenStreamRead(std::ifstream& stream, const std::string& fieldName, const Savepoint& savepoint) const
{
    std::ostringstream fname;
    fname << directory_ << "/" << prefix_ << "_" << fieldName << ".dat";

    // Check if field is already saved at savepoint and get offset
    OffsetTable::offset_t offset;
    try {
        offset = pOffsetTable_->GetOffset(savepoint, fieldName);
    }
    catch (SerializationException)
    {
        // Throw more detailed exception
        std::ostringstream errorstr;
        errorstr << "Error: field " << fieldName << " is not saved into serializer "
            << "at savepoint " << savepoint.ToString();
        SerializationException exception;
        exception.Init(errorstr.str());
        throw exception;
    }

    stream.open(fname.str().c_str(), std::ios::binary);
    stream.seekg(offset);
}